

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t close_and_restore_time(wchar_t fd,tree *t,restore_time *rt)

{
  int iVar1;
  wchar_t __fd;
  undefined1 local_68 [8];
  timeval times [2];
  timespec timespecs [2];
  restore_time *rt_local;
  tree *t_local;
  wchar_t fd_local;
  
  if (((t->flags & 0x80U) == 0) || (rt->noatime != 0)) {
    if (fd < L'\0') {
      t_local._4_4_ = L'\0';
    }
    else {
      t_local._4_4_ = close(fd);
    }
  }
  else {
    times[1].tv_usec = rt->atime;
    iVar1 = futimens(fd,(timespec *)&times[1].tv_usec);
    if (iVar1 == 0) {
      t_local._4_4_ = close(fd);
    }
    else {
      times[0].tv_usec = rt->mtime;
      times[1].tv_sec = rt->mtime_nsec / 1000;
      local_68 = (undefined1  [8])rt->atime;
      times[0].tv_sec = rt->atime_nsec / 1000;
      close(fd);
      __fd = tree_current_dir_fd(t);
      iVar1 = futimesat(__fd,rt->name,(timeval *)local_68);
      if (iVar1 == 0) {
        t_local._4_4_ = L'\0';
      }
      else {
        iVar1 = lutimes(rt->name,(timeval *)local_68);
        if (iVar1 == 0) {
          t_local._4_4_ = L'\0';
        }
        else {
          t_local._4_4_ = L'\xffffffff';
        }
      }
    }
  }
  return t_local._4_4_;
}

Assistant:

static int
close_and_restore_time(int fd, struct tree *t, struct restore_time *rt)
{
#ifndef HAVE_UTIMES
	(void)t; /* UNUSED */
	(void)rt; /* UNUSED */
	return (close(fd));
#else
#if defined(HAVE_FUTIMENS) && !defined(__CYGWIN__)
	struct timespec timespecs[2];
#endif
	struct timeval times[2];

	if ((t->flags & needsRestoreTimes) == 0 || rt->noatime) {
		if (fd >= 0)
			return (close(fd));
		else
			return (0);
	}

#if defined(HAVE_FUTIMENS) && !defined(__CYGWIN__)
	timespecs[1].tv_sec = rt->mtime;
	timespecs[1].tv_nsec = rt->mtime_nsec;

	timespecs[0].tv_sec = rt->atime;
	timespecs[0].tv_nsec = rt->atime_nsec;
	/* futimens() is defined in POSIX.1-2008. */
	if (futimens(fd, timespecs) == 0)
		return (close(fd));
#endif

	times[1].tv_sec = rt->mtime;
	times[1].tv_usec = rt->mtime_nsec / 1000;

	times[0].tv_sec = rt->atime;
	times[0].tv_usec = rt->atime_nsec / 1000;

#if !defined(HAVE_FUTIMENS) && defined(HAVE_FUTIMES) && !defined(__CYGWIN__)
	if (futimes(fd, times) == 0)
		return (close(fd));
#endif
	close(fd);
#if defined(HAVE_FUTIMESAT)
	if (futimesat(tree_current_dir_fd(t), rt->name, times) == 0)
		return (0);
#endif
#ifdef HAVE_LUTIMES
	if (lutimes(rt->name, times) != 0)
#else
	if (AE_IFLNK != rt->filetype && utimes(rt->name, times) != 0)
#endif
		return (-1);
#endif
	return (0);
}